

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

vector<std::any,_std::allocator<std::any>_> * __thiscall
Json::init_array_contents
          (vector<std::any,_std::allocator<std::any>_> *__return_storage_ptr__,Json *this,string *s,
          size_t start)

{
  char a;
  size_t i;
  any value;
  size_t local_60;
  any local_58;
  code *local_40 [2];
  
  (__return_storage_ptr__->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  local_58._M_storage._M_ptr = (void *)0x0;
  if (start < s->_M_string_length) {
    local_60 = start;
    do {
      init_right_of_pair((Json *)local_40,(string *)this,(size_t *)s);
      std::any::operator=(&local_58,(any *)local_40);
      if (local_40[0] != (code *)0x0) {
        (*local_40[0])(3,(Json *)local_40,0);
        local_40[0] = (code *)0x0;
      }
      std::vector<std::any,_std::allocator<std::any>_>::push_back(__return_storage_ptr__,&local_58);
      a = (s->_M_dataplus)._M_p[local_60];
      if (a == ']') break;
      this = (Json *)0x2c;
      JsonTools::expect_(a,',');
      local_60 = local_60 + 1;
    } while (local_60 < s->_M_string_length);
  }
  if (local_58._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_58._M_manager)(_Op_destroy,&local_58,(_Arg *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<any> Json::init_array_contents(string& s, size_t start){
	vector<any> result;
	any value;
	for (size_t i = start; i < s.size(); ++i) {
		value = init_right_of_pair(s, i);
		result.push_back(value);
		if (s[i] == ']') break;
		else JsonTools::expect_(s[i], ',');
	}
	return result;
}